

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O1

void stop_openssh_fixture(void)

{
  if (running_container_id == (char *)0x0) {
    if (have_docker != 0) {
      stop_openssh_fixture_cold_1();
    }
  }
  else {
    if (have_docker != 0) {
      run_command((char **)0x0,"docker stop %s");
    }
    free(running_container_id);
    running_container_id = (char *)0x0;
  }
  return;
}

Assistant:

void stop_openssh_fixture(void)
{
    if(running_container_id) {
        stop_openssh_server(running_container_id);
        free(running_container_id);
        running_container_id = NULL;
    }
    else if(have_docker) {
        fprintf(stderr, "Cannot stop container - none started\n");
    }
}